

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O1

void DumpMetaData(PtexMetaData *meta)

{
  _Alloc_hider _Var1;
  int iVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  char *pcVar5;
  _Rb_tree_node_base *p_Var6;
  int iVar7;
  ulong uVar8;
  _Self __tmp;
  char *key;
  MetaDataType type;
  char *key_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  sortedkeys;
  char *local_90;
  MetaDataType local_88;
  allocator<char> local_81;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    iVar2 = (*meta->_vptr_PtexMetaData[3])(meta);
    iVar7 = (int)uVar8;
    if (iVar2 <= iVar7) break;
    (*meta->_vptr_PtexMetaData[4])(meta,uVar8,&local_90,&local_88);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,local_90,&local_81);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&local_60,&local_80);
    *pmVar3 = iVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    uVar8 = (ulong)(iVar7 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"meta:",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      (*meta->_vptr_PtexMetaData[4])(meta,(ulong)p_Var6[2]._M_color,&local_80,&local_88);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      _Var1._M_p = local_80._M_dataplus._M_p;
      if (local_80._M_dataplus._M_p == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1591a8);
      }
      else {
        sVar4 = strlen(local_80._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type=",6);
      pcVar5 = Ptex::v2_4::MetaDataTypeName(local_88);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1591a8);
      }
      else {
        sVar4 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar4);
      }
      switch(local_88) {
      case mdt_string:
        local_90 = (char *)0x0;
        (*meta->_vptr_PtexMetaData[6])(meta,local_80._M_dataplus._M_p,&local_90);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        pcVar5 = local_90;
        if (local_90 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1591a8);
        }
        else {
          sVar4 = strlen(local_90);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar4);
        }
        break;
      case mdt_int8:
        DumpMetaArrayVal<signed_char>::operator()
                  ((DumpMetaArrayVal<signed_char> *)&local_90,meta,local_80._M_dataplus._M_p);
        break;
      case mdt_int16:
        DumpMetaArrayVal<short>::operator()
                  ((DumpMetaArrayVal<short> *)&local_90,meta,local_80._M_dataplus._M_p);
        break;
      case mdt_int32:
        DumpMetaArrayVal<int>::operator()
                  ((DumpMetaArrayVal<int> *)&local_90,meta,local_80._M_dataplus._M_p);
        break;
      case mdt_float:
        DumpMetaArrayVal<float>::operator()
                  ((DumpMetaArrayVal<float> *)&local_90,meta,local_80._M_dataplus._M_p);
        break;
      case mdt_double:
        DumpMetaArrayVal<double>::operator()
                  ((DumpMetaArrayVal<double> *)&local_90,meta,local_80._M_dataplus._M_p);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DumpMetaData(PtexMetaData* meta)
{
    // Sort the meta keys before printing them out because the
    // internal key order may change depending on whether large meta
    // data support was included.  Normally the key order shouldn't
    // matter, but we don't want it to cause the regression test to fail.

    std::map<std::string,int> sortedkeys;
    for (int i = 0; i < meta->numKeys(); i++)
    {
        const char* key;
        Ptex::MetaDataType type;
        meta->getKey(i, key, type);
        sortedkeys[key] = i;
    }

    std::cout << "meta:" << std::endl;
    std::map<std::string,int>::iterator iter;
    for (iter = sortedkeys.begin(); iter != sortedkeys.end(); iter++) {
        const char* key;
        Ptex::MetaDataType type;
        meta->getKey(iter->second, key, type);
        std::cout << "  " << key << " type=" << Ptex::MetaDataTypeName(type);
        switch (type) {
        case Ptex::mdt_string:
            {
                const char* val=0;
                meta->getValue(key, val);
                std::cout <<  "  " << val;
            }
            break;
        case Ptex::mdt_int8:   DumpMetaArrayVal<int8_t>()(meta, key); break;
        case Ptex::mdt_int16:  DumpMetaArrayVal<int16_t>()(meta, key); break;
        case Ptex::mdt_int32:  DumpMetaArrayVal<int32_t>()(meta, key); break;
        case Ptex::mdt_float:  DumpMetaArrayVal<float>()(meta, key); break;
        case Ptex::mdt_double: DumpMetaArrayVal<double>()(meta, key); break;
        }
        std::cout << std::endl;
    }
}